

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2aTextureMipmapTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles2::Accuracy::TextureCubeMipmapCase::iterate(TextureCubeMipmapCase *this)

{
  int width;
  code *pcVar1;
  RenderContext *context;
  TestContext *this_00;
  int iVar2;
  int iVar3;
  int iVar4;
  deUint32 dVar5;
  int iVar6;
  TextureCube *pTVar7;
  undefined4 extraout_var;
  TestLog *log_00;
  undefined4 extraout_var_00;
  char *pcVar9;
  NotSupportedError *this_01;
  size_type sVar10;
  reference pvVar11;
  int *piVar12;
  reference pvVar13;
  undefined4 extraout_var_01;
  PixelFormat *colorFmt;
  int iVar14;
  string local_260;
  int local_23c;
  int local_238;
  int score;
  int worstScoreDiff;
  int bestScoreDiff;
  TextureCubeView local_208;
  undefined1 local_1d0 [8];
  SurfaceAccess idealDst;
  ReferenceParams params;
  CubeFace cubeFace;
  int curH;
  int curW;
  int curY;
  int curX;
  int cellNdx;
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> gridLayout;
  Surface idealFrame;
  undefined1 local_c0 [8];
  Surface renderedFrame;
  undefined1 local_a0 [6];
  bool useLodBias;
  bool isProjected;
  vector<float,_std::allocator<float>_> texCoord;
  Sampler sampler;
  RandomViewport viewport;
  TestLog *log;
  Functions *gl;
  int defViewportHeight;
  int defViewportWidth;
  int texHeight;
  int texWidth;
  deUint32 magFilter;
  TextureCubeMipmapCase *this_local;
  long lVar8;
  
  pTVar7 = glu::TextureCube::getRefTexture(this->m_texture);
  iVar2 = tcu::TextureCube::getSize(pTVar7);
  pTVar7 = glu::TextureCube::getRefTexture(this->m_texture);
  iVar3 = tcu::TextureCube::getSize(pTVar7);
  iVar4 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar4);
  log_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
  iVar4 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  pcVar9 = tcu::TestNode::getName((TestNode *)this);
  dVar5 = deStringHash(pcVar9);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            ((RandomViewport *)&sampler.seamlessCubeMap,
             (RenderTarget *)CONCAT44(extraout_var_00,iVar4),iVar2 * 2,iVar3 * 2,dVar5);
  glu::mapGLSampler((Sampler *)
                    ((long)&texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 4),this->m_wrapS,
                    this->m_wrapT,this->m_minFilter,0x2600);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_a0);
  renderedFrame.m_pixels.m_cap._7_1_ = this->m_coordType == COORDTYPE_PROJECTED;
  renderedFrame.m_pixels.m_cap._6_1_ = this->m_coordType == COORDTYPE_BASIC_BIAS;
  tcu::Surface::Surface((Surface *)local_c0,viewport.x,viewport.y);
  tcu::Surface::Surface
            ((Surface *)
             &gridLayout.
              super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage,viewport.x,viewport.y);
  if ((iVar2 * 2 <= viewport.x) && (iVar3 * 2 <= viewport.y)) {
    glu::TextureCube::upload(this->m_texture);
    (**(code **)(lVar8 + 8))(0x84c0);
    pcVar1 = *(code **)(lVar8 + 0xb8);
    dVar5 = glu::TextureCube::getGLTexture(this->m_texture);
    (*pcVar1)(0x8513,dVar5);
    (**(code **)(lVar8 + 0x1360))(0x8513,0x2802,this->m_wrapS);
    (**(code **)(lVar8 + 0x1360))(0x8513,0x2803,this->m_wrapT);
    (**(code **)(lVar8 + 0x1360))(0x8513,0x2801,this->m_minFilter);
    (**(code **)(lVar8 + 0x1360))(0x8513,0x2800,0x2600);
    dVar5 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar5,"After texture setup",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/accuracy/es2aTextureMipmapTests.cpp"
                    ,0x239);
    std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::vector
              ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)&curX);
    computeGridLayout((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)&curX,
                      viewport.x,viewport.y);
    if (iterate()::s_projections == '\0') {
      iVar4 = __cxa_guard_acquire(&iterate()::s_projections);
      if (iVar4 != 0) {
        tcu::Vector<float,_4>::Vector(iterate::s_projections,1.2,1.0,0.7,1.0);
        tcu::Vector<float,_4>::Vector(iterate::s_projections + 1,1.3,0.8,0.6,1.1);
        tcu::Vector<float,_4>::Vector(iterate::s_projections + 2,0.8,1.0,1.2,0.8);
        tcu::Vector<float,_4>::Vector(iterate::s_projections + 3,1.2,1.0,1.3,0.9);
        __cxa_guard_release(&iterate()::s_projections);
      }
    }
    curY = 0;
    while( true ) {
      sVar10 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::size
                         ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)
                          &curX);
      if ((int)sVar10 <= curY) break;
      pvVar11 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                          ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)
                           &curX,(long)curY);
      piVar12 = tcu::Vector<int,_4>::x(pvVar11);
      iVar4 = *piVar12;
      pvVar11 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                          ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)
                           &curX,(long)curY);
      piVar12 = tcu::Vector<int,_4>::y(pvVar11);
      iVar14 = *piVar12;
      pvVar11 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                          ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)
                           &curX,(long)curY);
      piVar12 = tcu::Vector<int,_4>::z(pvVar11);
      width = *piVar12;
      pvVar11 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                          ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)
                           &curX,(long)curY);
      piVar12 = tcu::Vector<int,_4>::w(pvVar11);
      params.maxLevel = *piVar12;
      params.baseLevel = curY % 6;
      glu::TextureTestUtil::ReferenceParams::ReferenceParams
                ((ReferenceParams *)&idealDst.field_0x1c,TEXTURETYPE_CUBE);
      tcu::Sampler::operator=
                ((Sampler *)(params.super_RenderParams.colorBias.m_data + 2),
                 (Sampler *)
                 ((long)&texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 4));
      glu::TextureTestUtil::computeQuadTexCoordCube
                ((vector<float,_std::allocator<float>_> *)local_a0,params.baseLevel);
      if ((renderedFrame.m_pixels.m_cap._7_1_ & 1) != 0) {
        params.super_RenderParams.texType = params.super_RenderParams.texType | TEXTURETYPE_CUBE;
        params.super_RenderParams.samplerType =
             (SamplerType)iterate::s_projections[curY % 4].m_data[0];
        params.super_RenderParams.flags = (deUint32)iterate::s_projections[curY % 4].m_data[1];
        params.super_RenderParams.w.m_data._0_8_ =
             *(undefined8 *)(iterate::s_projections[curY % 4].m_data + 2);
      }
      if ((renderedFrame.m_pixels.m_cap._6_1_ & 1) != 0) {
        params.super_RenderParams.texType = params.super_RenderParams.texType | TEXTURETYPE_2D_ARRAY
        ;
        params.super_RenderParams.w.m_data[2] = iterate::s_bias[curY % 8];
      }
      (**(code **)(lVar8 + 0x1a00))
                (sampler._52_4_ + iVar4,sampler.depthStencilMode + iVar14,width,params.maxLevel);
      pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                          ((vector<float,_std::allocator<float>_> *)local_a0,0);
      deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
                (&this->m_renderer,0,pvVar13,(RenderParams *)&idealDst.field_0x1c);
      iVar6 = (*this->m_renderCtx->_vptr_RenderContext[4])();
      colorFmt = tcu::RenderTarget::getPixelFormat((RenderTarget *)CONCAT44(extraout_var_01,iVar6));
      tcu::SurfaceAccess::SurfaceAccess
                ((SurfaceAccess *)local_1d0,
                 (Surface *)
                 &gridLayout.
                  super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,colorFmt,iVar4,iVar14,width,
                 params.maxLevel);
      params.sampler.seamlessCubeMap = false;
      params.sampler._53_3_ = 0;
      pTVar7 = glu::TextureCube::getRefTexture(this->m_texture);
      tcu::TextureCube::operator_cast_to_TextureCubeView(&local_208,pTVar7);
      pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                          ((vector<float,_std::allocator<float>_> *)local_a0,0);
      glu::TextureTestUtil::sampleTexture
                ((SurfaceAccess *)local_1d0,&local_208,pvVar13,
                 (ReferenceParams *)&idealDst.field_0x1c);
      curY = curY + 1;
    }
    context = this->m_renderCtx;
    tcu::Surface::getAccess((PixelBufferAccess *)&worstScoreDiff,(Surface *)local_c0);
    glu::readPixels(context,sampler._52_4_,sampler.depthStencilMode,
                    (PixelBufferAccess *)&worstScoreDiff);
    iVar4 = iVar2;
    if (iVar2 < 0) {
      iVar4 = iVar2 + 0xf;
    }
    iVar14 = iVar3;
    if (iVar3 < 0) {
      iVar14 = iVar3 + 0xf;
    }
    score = (iVar4 >> 4) * (iVar14 >> 4);
    local_238 = iVar2 * iVar3;
    local_23c = glu::TextureTestUtil::measureAccuracy
                          (log_00,(Surface *)
                                  &gridLayout.
                                   super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (Surface *)local_c0,score,local_238);
    this_00 = (this->super_TestCase).super_TestNode.m_testCtx;
    de::toString<int>(&local_260,&local_23c);
    pcVar9 = (char *)std::__cxx11::string::c_str();
    tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,pcVar9);
    std::__cxx11::string::~string((string *)&local_260);
    std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::~vector
              ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)&curX);
    tcu::Surface::~Surface
              ((Surface *)
               &gridLayout.
                super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    tcu::Surface::~Surface((Surface *)local_c0);
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)local_a0);
    return STOP;
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_01,"Too small viewport","",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/accuracy/es2aTextureMipmapTests.cpp"
             ,0x22a);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

TextureCubeMipmapCase::IterateResult TextureCubeMipmapCase::iterate (void)
{
	// Constants.
	const deUint32			magFilter			= GL_NEAREST;

	int						texWidth			= m_texture->getRefTexture().getSize();
	int						texHeight			= m_texture->getRefTexture().getSize();

	int						defViewportWidth	= texWidth*2;
	int						defViewportHeight	= texHeight*2;

	const glw::Functions&	gl					= m_renderCtx.getFunctions();
	TestLog&				log					= m_testCtx.getLog();
	RandomViewport			viewport			(m_renderCtx.getRenderTarget(), defViewportWidth, defViewportHeight, deStringHash(getName()));
	tcu::Sampler			sampler				= mapGLSampler(m_wrapS, m_wrapT, m_minFilter, magFilter);

	vector<float>			texCoord;

	bool					isProjected			= m_coordType == COORDTYPE_PROJECTED;
	bool					useLodBias			= m_coordType == COORDTYPE_BASIC_BIAS;

	tcu::Surface			renderedFrame		(viewport.width, viewport.height);

	// Accuracy cases test against ideal lod computation.
	tcu::Surface			idealFrame			(viewport.width, viewport.height);

	// Accuracy measurements are off unless we get the expected viewport size.
	if (viewport.width < defViewportWidth || viewport.height < defViewportHeight)
		throw tcu::NotSupportedError("Too small viewport", "", __FILE__, __LINE__);

	// Upload texture data.
	m_texture->upload();

	// Use unit 0.
	gl.activeTexture(GL_TEXTURE0);

	// Bind gradient texture and setup sampler parameters.
	gl.bindTexture(GL_TEXTURE_CUBE_MAP, m_texture->getGLTexture());
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_S,		m_wrapS);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_T,		m_wrapT);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MIN_FILTER,	m_minFilter);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MAG_FILTER,	magFilter);

	GLU_EXPECT_NO_ERROR(gl.getError(), "After texture setup");

	// Compute grid.
	vector<IVec4> gridLayout;
	computeGridLayout(gridLayout, viewport.width, viewport.height);

	// Bias values.
	static const float s_bias[] = { 1.0f, -2.0f, 0.8f, -0.5f, 1.5f, 0.9f, 2.0f, 4.0f };

	// Projection values \note Less agressive than in 2D case due to smaller quads.
	static const Vec4 s_projections[] =
	{
		Vec4(1.2f, 1.0f, 0.7f, 1.0f),
		Vec4(1.3f, 0.8f, 0.6f, 1.1f),
		Vec4(0.8f, 1.0f, 1.2f, 0.8f),
		Vec4(1.2f, 1.0f, 1.3f, 0.9f)
	};

	for (int cellNdx = 0; cellNdx < (int)gridLayout.size(); cellNdx++)
	{
		int				curX		= gridLayout[cellNdx].x();
		int				curY		= gridLayout[cellNdx].y();
		int				curW		= gridLayout[cellNdx].z();
		int				curH		= gridLayout[cellNdx].w();
		tcu::CubeFace	cubeFace	= (tcu::CubeFace)(cellNdx % tcu::CUBEFACE_LAST);
		ReferenceParams	params		(TEXTURETYPE_CUBE);

		params.sampler = sampler;

		DE_ASSERT(m_coordType != COORDTYPE_AFFINE); // Not supported.
		computeQuadTexCoordCube(texCoord, cubeFace);

		if (isProjected)
		{
			params.flags	|= ReferenceParams::PROJECTED;
			params.w		 = s_projections[cellNdx % DE_LENGTH_OF_ARRAY(s_projections)];
		}

		if (useLodBias)
		{
			params.flags	|= ReferenceParams::USE_BIAS;
			params.bias		 = s_bias[cellNdx % DE_LENGTH_OF_ARRAY(s_bias)];
		}

		// Render with GL.
		gl.viewport(viewport.x+curX, viewport.y+curY, curW, curH);
		m_renderer.renderQuad(0, &texCoord[0], params);

		// Render reference(s).
		{
			tcu::SurfaceAccess idealDst(idealFrame, m_renderCtx.getRenderTarget().getPixelFormat(), curX, curY, curW, curH);
			params.lodMode = LODMODE_EXACT;
			sampleTexture(idealDst, m_texture->getRefTexture(), &texCoord[0], params);
		}
	}

	// Read result.
	glu::readPixels(m_renderCtx, viewport.x, viewport.y, renderedFrame.getAccess());

	// Compare and log.
	{
		const int	bestScoreDiff	= (texWidth/16)*(texHeight/16);
		const int	worstScoreDiff	= texWidth*texHeight;

		int score = measureAccuracy(log, idealFrame, renderedFrame, bestScoreDiff, worstScoreDiff);
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, de::toString(score).c_str());
	}

	return STOP;
}